

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O0

void __thiscall
rr::FragmentProcessor::render
          (FragmentProcessor *this,MultisamplePixelBufferAccess *msColorBuffer,
          MultisamplePixelBufferAccess *msDepthBuffer,MultisamplePixelBufferAccess *msStencilBuffer,
          Fragment *inputFragments,int numFragments,FaceType fragmentFacing,
          FragmentOperationState *state)

{
  float a;
  bool bVar1;
  bool bVar2;
  int iVar3;
  TextureChannelClass TVar4;
  int fragNdxOffset;
  int iVar5;
  ConstPixelBufferAccess *this_00;
  ConstPixelBufferAccess *this_01;
  ConstPixelBufferAccess *this_02;
  ConstPixelBufferAccess *this_03;
  TextureFormat *pTVar6;
  StencilState *stencilState_00;
  bool *pbVar7;
  float *pfVar8;
  long lVar9;
  char cVar10;
  float fVar11;
  byte local_37d;
  bool local_371;
  float local_368;
  float local_35c;
  float local_350;
  float local_348;
  float local_33c;
  float local_330;
  float local_324;
  float local_31c;
  byte local_313;
  byte local_312;
  anon_union_16_3_1194ccdc_for_v local_300;
  Fragment *local_2f0;
  Fragment *frag_4;
  undefined1 auStack_2e0 [4];
  int regSampleNdx_7;
  undefined8 local_2d8;
  Fragment *local_2d0;
  Fragment *frag_3;
  int regSampleNdx_6;
  undefined1 local_2b8 [12];
  undefined1 local_2ac [12];
  undefined8 local_2a0;
  float local_298;
  int local_294;
  int regSampleNdx_5;
  Vector<float,_4> local_280;
  VecAccess<float,_4,_3> local_270;
  undefined8 local_254;
  float local_24c;
  Fragment *local_248;
  Fragment *frag_2;
  int regSampleNdx_4;
  Vec4 local_228;
  undefined8 local_218;
  undefined8 local_210;
  Vec4 local_208;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8 [8];
  Vec4 dstColor_1;
  Vec4 srcColor;
  Fragment *frag_1;
  int fragSampleNdx_2;
  int regSampleNdx_3;
  undefined8 local_1a8;
  undefined8 local_1a0;
  Vector<float,_4> local_198;
  undefined8 local_188;
  undefined8 local_180;
  Vector<float,_4> local_178;
  undefined8 local_168;
  undefined8 local_160;
  undefined1 local_158 [8];
  Vec4 dstColor;
  Fragment *frag;
  int local_138;
  int fragSampleNdx_1;
  int regSampleNdx_2;
  float local_12c [2];
  Vector<float,_4> local_124;
  Vector<float,_4> local_114;
  Vector<float,_4> local_104;
  Vector<float,_4> local_f4;
  Vector<float,_4> local_e4;
  undefined1 local_d4 [8];
  Vec4 maxClampValue;
  Vec4 minClampValue;
  int regSampleNdx_1;
  int fragSampleNdx;
  int fragNdx;
  int regSampleNdx;
  int groupFirstFragNdx;
  int sampleGroupNdx;
  undefined1 local_90 [7];
  bool sRGBTarget;
  Vec4 colorMaskNegationFactor;
  Vec4 colorMaskFactor;
  StencilState *stencilState;
  int numSampleGroups;
  int totalNumSamples;
  int numSamplesPerFragment;
  GenericVecType fragmentDataType;
  TextureChannelClass colorbufferClass;
  bool doStencilTest;
  bool doDepthTest;
  bool hasStencil;
  bool hasDepth;
  PixelBufferAccess *stencilBuffer;
  PixelBufferAccess *depthBuffer;
  PixelBufferAccess *colorBuffer;
  int numFragments_local;
  Fragment *inputFragments_local;
  MultisamplePixelBufferAccess *msStencilBuffer_local;
  MultisamplePixelBufferAccess *msDepthBuffer_local;
  MultisamplePixelBufferAccess *msColorBuffer_local;
  FragmentProcessor *this_local;
  
  this_00 = &MultisamplePixelBufferAccess::raw(msColorBuffer)->super_ConstPixelBufferAccess;
  this_01 = &MultisamplePixelBufferAccess::raw(msDepthBuffer)->super_ConstPixelBufferAccess;
  this_02 = &MultisamplePixelBufferAccess::raw(msStencilBuffer)->super_ConstPixelBufferAccess;
  iVar3 = tcu::ConstPixelBufferAccess::getWidth(this_01);
  bVar2 = false;
  if (0 < iVar3) {
    iVar3 = tcu::ConstPixelBufferAccess::getHeight(this_01);
    bVar2 = false;
    if (0 < iVar3) {
      iVar3 = tcu::ConstPixelBufferAccess::getDepth(this_01);
      bVar2 = 0 < iVar3;
    }
  }
  iVar3 = tcu::ConstPixelBufferAccess::getWidth(this_02);
  bVar1 = false;
  if (0 < iVar3) {
    iVar3 = tcu::ConstPixelBufferAccess::getHeight(this_02);
    bVar1 = false;
    if (0 < iVar3) {
      iVar3 = tcu::ConstPixelBufferAccess::getDepth(this_02);
      bVar1 = 0 < iVar3;
    }
  }
  local_312 = 0;
  if (bVar2) {
    local_312 = state->depthTestEnabled;
  }
  local_313 = 0;
  if (bVar1) {
    local_313 = state->stencilTestEnabled;
  }
  this_03 = &MultisamplePixelBufferAccess::raw(msColorBuffer)->super_ConstPixelBufferAccess;
  pTVar6 = tcu::ConstPixelBufferAccess::getFormat(this_03);
  TVar4 = tcu::getTextureChannelClass(pTVar6->type);
  if (TVar4 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
    cVar10 = '\x02';
  }
  else {
    cVar10 = TVar4 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER;
  }
  iVar3 = tcu::ConstPixelBufferAccess::getWidth(this_00);
  stencilState_00 = state->stencilStates + fragmentFacing;
  pbVar7 = tcu::Vector<bool,_4>::operator[](&state->colorMask,0);
  local_31c = 1.0;
  if ((*pbVar7 & 1U) == 0) {
    local_31c = 0.0;
  }
  pbVar7 = tcu::Vector<bool,_4>::operator[](&state->colorMask,1);
  local_324 = 1.0;
  if ((*pbVar7 & 1U) == 0) {
    local_324 = 0.0;
  }
  pbVar7 = tcu::Vector<bool,_4>::operator[](&state->colorMask,2);
  local_330 = 1.0;
  if ((*pbVar7 & 1U) == 0) {
    local_330 = 0.0;
  }
  pbVar7 = tcu::Vector<bool,_4>::operator[](&state->colorMask,3);
  local_33c = 1.0;
  if ((*pbVar7 & 1U) == 0) {
    local_33c = 0.0;
  }
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(colorMaskNegationFactor.m_data + 2),local_31c,local_324,local_330,
             local_33c);
  pbVar7 = tcu::Vector<bool,_4>::operator[](&state->colorMask,0);
  local_348 = 0.0;
  if ((*pbVar7 & 1U) == 0) {
    local_348 = 1.0;
  }
  pbVar7 = tcu::Vector<bool,_4>::operator[](&state->colorMask,1);
  local_350 = 0.0;
  if ((*pbVar7 & 1U) == 0) {
    local_350 = 1.0;
  }
  pbVar7 = tcu::Vector<bool,_4>::operator[](&state->colorMask,2);
  local_35c = 0.0;
  if ((*pbVar7 & 1U) == 0) {
    local_35c = 1.0;
  }
  pbVar7 = tcu::Vector<bool,_4>::operator[](&state->colorMask,3);
  local_368 = 0.0;
  if ((*pbVar7 & 1U) == 0) {
    local_368 = 1.0;
  }
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)local_90,local_348,local_350,local_35c,local_368);
  local_371 = false;
  if ((state->sRGBEnabled & 1U) != 0) {
    pTVar6 = tcu::ConstPixelBufferAccess::getFormat(this_00);
    local_371 = tcu::isSRGB(*pTVar6);
  }
  for (regSampleNdx = 0; regSampleNdx < (numFragments * iVar3 + -1) / 0x40 + 1;
      regSampleNdx = regSampleNdx + 1) {
    fragNdxOffset = (regSampleNdx << 6) / iVar3;
    for (fragSampleNdx = 0; fragSampleNdx < 0x40; fragSampleNdx = fragSampleNdx + 1) {
      iVar5 = fragNdxOffset + fragSampleNdx / iVar3;
      if (iVar5 < numFragments) {
        this->m_sampleRegister[fragSampleNdx].isAlive =
             (inputFragments[iVar5].coverage & 1 << ((byte)(fragSampleNdx % iVar3) & 0x1f)) != 0;
        this->m_sampleRegister[fragSampleNdx].depthPassed = true;
      }
      else {
        this->m_sampleRegister[fragSampleNdx].isAlive = false;
      }
    }
    if ((state->scissorTestEnabled & 1U) != 0) {
      executeScissorTest(this,fragNdxOffset,iVar3,inputFragments,&state->scissorRectangle);
    }
    if ((local_313 & 1) != 0) {
      executeStencilCompare
                (this,fragNdxOffset,iVar3,inputFragments,stencilState_00,state->numStencilBits,
                 this_02);
      executeStencilSFail(this,fragNdxOffset,iVar3,inputFragments,stencilState_00,
                          state->numStencilBits,(PixelBufferAccess *)this_02);
    }
    if (((local_312 & 1) != 0) &&
       (executeDepthCompare(this,fragNdxOffset,iVar3,inputFragments,state->depthFunc,this_01),
       (state->depthMask & 1U) != 0)) {
      executeDepthWrite(this,fragNdxOffset,iVar3,inputFragments,(PixelBufferAccess *)this_01);
    }
    if ((local_313 & 1) != 0) {
      executeStencilDpFailAndPass
                (this,fragNdxOffset,iVar3,inputFragments,stencilState_00,state->numStencilBits,
                 (PixelBufferAccess *)this_02);
    }
    if ((local_312 & 1) != 0) {
      for (minClampValue.m_data[2] = 0.0; (int)minClampValue.m_data[2] < 0x40;
          minClampValue.m_data[2] = (float)((int)minClampValue.m_data[2] + 1)) {
        local_37d = 0;
        if ((this->m_sampleRegister[(int)minClampValue.m_data[2]].isAlive & 1U) != 0) {
          local_37d = this->m_sampleRegister[(int)minClampValue.m_data[2]].depthPassed;
        }
        this->m_sampleRegister[(int)minClampValue.m_data[2]].isAlive = (bool)(local_37d & 1);
      }
    }
    if (cVar10 == '\0') {
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(maxClampValue.m_data + 2));
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_d4);
      if (TVar4 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
        tcu::Vector<float,_4>::Vector(&local_e4,0.0);
        maxClampValue.m_data[2] = local_e4.m_data[0];
        maxClampValue.m_data[3] = local_e4.m_data[1];
        tcu::Vector<float,_4>::Vector(&local_f4,1.0);
        local_d4._0_4_ = local_f4.m_data[0];
        local_d4._4_4_ = local_f4.m_data[1];
        maxClampValue.m_data[0] = local_f4.m_data[2];
        maxClampValue.m_data[1] = local_f4.m_data[3];
      }
      else if (TVar4 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
        tcu::Vector<float,_4>::Vector(&local_104,-1.0);
        maxClampValue.m_data[2] = local_104.m_data[0];
        maxClampValue.m_data[3] = local_104.m_data[1];
        tcu::Vector<float,_4>::Vector(&local_114,1.0);
        local_d4._0_4_ = local_114.m_data[0];
        local_d4._4_4_ = local_114.m_data[1];
        maxClampValue.m_data[0] = local_114.m_data[2];
        maxClampValue.m_data[1] = local_114.m_data[3];
      }
      else {
        fVar11 = std::numeric_limits<float>::infinity();
        tcu::Vector<float,_4>::Vector(&local_124,-fVar11);
        maxClampValue.m_data[2] = local_124.m_data[0];
        maxClampValue.m_data[3] = local_124.m_data[1];
        fVar11 = std::numeric_limits<float>::infinity();
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&fragSampleNdx_1,fVar11);
        local_d4._0_4_ = fragSampleNdx_1;
        local_d4._4_4_ = regSampleNdx_2;
        maxClampValue.m_data[0] = local_12c[0];
        maxClampValue.m_data[1] = local_12c[1];
      }
      if (state->blendMode == BLENDMODE_STANDARD) {
        for (local_138 = 0; local_138 < 0x40; local_138 = local_138 + 1) {
          if ((this->m_sampleRegister[local_138].isAlive & 1U) != 0) {
            dstColor.m_data._8_8_ = inputFragments + (fragNdxOffset + local_138 / iVar3);
            iVar5 = tcu::Vector<int,_2>::x((Vector<int,_2> *)dstColor.m_data._8_8_);
            tcu::Vector<int,_2>::y((Vector<int,_2> *)dstColor.m_data._8_8_);
            tcu::ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)local_158,(int)this_00,local_138 % iVar3,iVar5);
            GenericVec4::get<float>((GenericVec4 *)&local_178);
            tcu::clamp<float,4>((tcu *)&local_168,&local_178,
                                (Vector<float,_4> *)(maxClampValue.m_data + 2),
                                (Vector<float,_4> *)local_d4);
            *(undefined8 *)this->m_sampleRegister[local_138].clampedBlendSrcColor.m_data = local_168
            ;
            *(undefined8 *)(this->m_sampleRegister[local_138].clampedBlendSrcColor.m_data + 2) =
                 local_160;
            GenericVec4::get<float>((GenericVec4 *)&local_198);
            tcu::clamp<float,4>((tcu *)&local_188,&local_198,
                                (Vector<float,_4> *)(maxClampValue.m_data + 2),
                                (Vector<float,_4> *)local_d4);
            *(undefined8 *)this->m_sampleRegister[local_138].clampedBlendSrc1Color.m_data =
                 local_188;
            *(undefined8 *)(this->m_sampleRegister[local_138].clampedBlendSrc1Color.m_data + 2) =
                 local_180;
            if (local_371 == false) {
              tcu::Vector<float,_4>::Vector
                        ((Vector<float,_4> *)&fragSampleNdx_2,(Vector<float,_4> *)local_158);
            }
            else {
              tcu::sRGBToLinear((tcu *)&fragSampleNdx_2,(Vec4 *)local_158);
            }
            tcu::clamp<float,4>((tcu *)&local_1a8,(Vector<float,_4> *)&fragSampleNdx_2,
                                (Vector<float,_4> *)(maxClampValue.m_data + 2),
                                (Vector<float,_4> *)local_d4);
            *(undefined8 *)this->m_sampleRegister[local_138].clampedBlendDstColor.m_data = local_1a8
            ;
            *(undefined8 *)(this->m_sampleRegister[local_138].clampedBlendDstColor.m_data + 2) =
                 local_1a0;
          }
        }
        executeBlendFactorComputeRGB(this,&state->blendColor,&state->blendRGBState);
        executeBlendFactorComputeA(this,&state->blendColor,&state->blendAState);
        executeBlend(this,&state->blendRGBState,&state->blendAState);
      }
      else if (state->blendMode == BLENDMODE_ADVANCED) {
        for (frag_1._4_4_ = 0; frag_1._4_4_ < 0x40; frag_1._4_4_ = frag_1._4_4_ + 1) {
          if ((this->m_sampleRegister[frag_1._4_4_].isAlive & 1U) != 0) {
            GenericVec4::get<float>((GenericVec4 *)(dstColor_1.m_data + 2));
            iVar5 = tcu::Vector<int,_2>::x
                              (&inputFragments[fragNdxOffset + frag_1._4_4_ / iVar3].pixelCoord);
            tcu::Vector<int,_2>::y(&inputFragments[fragNdxOffset + frag_1._4_4_ / iVar3].pixelCoord)
            ;
            tcu::ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)local_1e8,(int)this_00,frag_1._4_4_ % iVar3,iVar5);
            tcu::clamp<float,4>((tcu *)&local_208,(Vector<float,_4> *)(dstColor_1.m_data + 2),
                                (Vector<float,_4> *)(maxClampValue.m_data + 2),
                                (Vector<float,_4> *)local_d4);
            unpremultiply((rr *)&local_1f8,&local_208);
            *(undefined8 *)this->m_sampleRegister[frag_1._4_4_].clampedBlendSrcColor.m_data =
                 local_1f8;
            *(undefined8 *)(this->m_sampleRegister[frag_1._4_4_].clampedBlendSrcColor.m_data + 2) =
                 local_1f0;
            if (local_371 == false) {
              tcu::Vector<float,_4>::Vector
                        ((Vector<float,_4> *)&stack0xfffffffffffffdc8,(Vector<float,_4> *)local_1e8)
              ;
            }
            else {
              tcu::sRGBToLinear((tcu *)&stack0xfffffffffffffdc8,(Vec4 *)local_1e8);
            }
            tcu::clamp<float,4>((tcu *)&local_228,(Vector<float,_4> *)&stack0xfffffffffffffdc8,
                                (Vector<float,_4> *)(maxClampValue.m_data + 2),
                                (Vector<float,_4> *)local_d4);
            unpremultiply((rr *)&local_218,&local_228);
            *(undefined8 *)this->m_sampleRegister[frag_1._4_4_].clampedBlendDstColor.m_data =
                 local_218;
            *(undefined8 *)(this->m_sampleRegister[frag_1._4_4_].clampedBlendDstColor.m_data + 2) =
                 local_210;
          }
        }
        executeAdvancedBlend(this,state->blendEquationAdvaced);
      }
      else {
        for (frag_2._4_4_ = 0; frag_2._4_4_ < 0x40; frag_2._4_4_ = frag_2._4_4_ + 1) {
          if ((this->m_sampleRegister[frag_2._4_4_].isAlive & 1U) != 0) {
            local_248 = inputFragments + (fragNdxOffset + frag_2._4_4_ / iVar3);
            GenericVec4::get<float>((GenericVec4 *)&local_280);
            tcu::Vector<float,_4>::xyz(&local_270,&local_280);
            tcu::VecAccess::operator_cast_to_Vector((VecAccess *)&local_254);
            *(undefined8 *)this->m_sampleRegister[frag_2._4_4_].blendedRGB.m_data = local_254;
            this->m_sampleRegister[frag_2._4_4_].blendedRGB.m_data[2] = local_24c;
            GenericVec4::get<float>((GenericVec4 *)&stack0xfffffffffffffd70);
            pfVar8 = tcu::Vector<float,_4>::w((Vector<float,_4> *)&stack0xfffffffffffffd70);
            this->m_sampleRegister[frag_2._4_4_].blendedA = *pfVar8;
          }
        }
      }
      if (TVar4 != TEXTURECHANNELCLASS_FLOATING_POINT) {
        for (local_294 = 0; local_294 < 0x40; local_294 = local_294 + 1) {
          if ((this->m_sampleRegister[local_294].isAlive & 1U) != 0) {
            lVar9 = (long)local_294;
            tcu::Vector<float,_4>::swizzle
                      ((Vector<float,_4> *)local_2ac,(int)&maxClampValue + 8,0,1);
            tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_2b8,(int)local_d4,0,1);
            tcu::clamp<float,3>((tcu *)&local_2a0,&this->m_sampleRegister[lVar9].blendedRGB,
                                (Vector<float,_3> *)local_2ac,(Vector<float,_3> *)local_2b8);
            *(undefined8 *)this->m_sampleRegister[local_294].blendedRGB.m_data = local_2a0;
            this->m_sampleRegister[local_294].blendedRGB.m_data[2] = local_298;
            fVar11 = this->m_sampleRegister[local_294].blendedA;
            pfVar8 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(maxClampValue.m_data + 2));
            a = *pfVar8;
            pfVar8 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_d4);
            fVar11 = de::clamp<float>(fVar11,a,*pfVar8);
            this->m_sampleRegister[local_294].blendedA = fVar11;
          }
        }
      }
      pbVar7 = tcu::Vector<bool,_4>::operator[](&state->colorMask,0);
      if (((((*pbVar7 & 1U) == 0) ||
           (pbVar7 = tcu::Vector<bool,_4>::operator[](&state->colorMask,1), (*pbVar7 & 1U) == 0)) ||
          (pbVar7 = tcu::Vector<bool,_4>::operator[](&state->colorMask,2), (*pbVar7 & 1U) == 0)) ||
         (pbVar7 = tcu::Vector<bool,_4>::operator[](&state->colorMask,3), (*pbVar7 & 1U) == 0)) {
        pbVar7 = tcu::Vector<bool,_4>::operator[](&state->colorMask,0);
        if ((((*pbVar7 & 1U) != 0) ||
            (pbVar7 = tcu::Vector<bool,_4>::operator[](&state->colorMask,1), (*pbVar7 & 1U) != 0))
           || ((pbVar7 = tcu::Vector<bool,_4>::operator[](&state->colorMask,2), (*pbVar7 & 1U) != 0
               || (pbVar7 = tcu::Vector<bool,_4>::operator[](&state->colorMask,3),
                  (*pbVar7 & 1U) != 0)))) {
          executeMaskedColorWrite
                    (this,fragNdxOffset,iVar3,inputFragments,
                     (Vec4 *)(colorMaskNegationFactor.m_data + 2),(Vec4 *)local_90,local_371,
                     (PixelBufferAccess *)this_00);
        }
      }
      else {
        pTVar6 = tcu::ConstPixelBufferAccess::getFormat(this_00);
        tcu::TextureFormat::TextureFormat((TextureFormat *)&stack0xfffffffffffffd40,RGBA,UNORM_INT8)
        ;
        bVar2 = tcu::TextureFormat::operator==(pTVar6,(TextureFormat *)&stack0xfffffffffffffd40);
        if (bVar2) {
          executeRGBA8ColorWrite
                    (this,fragNdxOffset,iVar3,inputFragments,(PixelBufferAccess *)this_00);
        }
        else {
          executeColorWrite(this,fragNdxOffset,iVar3,inputFragments,local_371,
                            (PixelBufferAccess *)this_00);
        }
      }
    }
    else if (cVar10 == '\x01') {
      for (frag_4._4_4_ = 0; frag_4._4_4_ < 0x40; frag_4._4_4_ = frag_4._4_4_ + 1) {
        if ((this->m_sampleRegister[frag_4._4_4_].isAlive & 1U) != 0) {
          local_2f0 = inputFragments + (fragNdxOffset + frag_4._4_4_ / iVar3);
          GenericVec4::get<unsigned_int>((GenericVec4 *)&local_300);
          *(undefined8 *)this->m_sampleRegister[frag_4._4_4_].unsignedValue.m_data = local_300._0_8_
          ;
          *(undefined8 *)(this->m_sampleRegister[frag_4._4_4_].unsignedValue.m_data + 2) =
               local_300._8_8_;
        }
      }
      pbVar7 = tcu::Vector<bool,_4>::operator[](&state->colorMask,0);
      if ((((*pbVar7 & 1U) != 0) ||
          (pbVar7 = tcu::Vector<bool,_4>::operator[](&state->colorMask,1), (*pbVar7 & 1U) != 0)) ||
         ((pbVar7 = tcu::Vector<bool,_4>::operator[](&state->colorMask,2), (*pbVar7 & 1U) != 0 ||
          (pbVar7 = tcu::Vector<bool,_4>::operator[](&state->colorMask,3), (*pbVar7 & 1U) != 0)))) {
        executeUnsignedValueWrite
                  (this,fragNdxOffset,iVar3,inputFragments,&state->colorMask,
                   (PixelBufferAccess *)this_00);
      }
    }
    else if (cVar10 == '\x02') {
      for (frag_3._4_4_ = 0; frag_3._4_4_ < 0x40; frag_3._4_4_ = frag_3._4_4_ + 1) {
        if ((this->m_sampleRegister[frag_3._4_4_].isAlive & 1U) != 0) {
          local_2d0 = inputFragments + (fragNdxOffset + frag_3._4_4_ / iVar3);
          GenericVec4::get<int>((GenericVec4 *)auStack_2e0);
          *(undefined8 *)this->m_sampleRegister[frag_3._4_4_].signedValue.m_data = _auStack_2e0;
          *(undefined8 *)(this->m_sampleRegister[frag_3._4_4_].signedValue.m_data + 2) = local_2d8;
        }
      }
      pbVar7 = tcu::Vector<bool,_4>::operator[](&state->colorMask,0);
      if (((((*pbVar7 & 1U) != 0) ||
           (pbVar7 = tcu::Vector<bool,_4>::operator[](&state->colorMask,1), (*pbVar7 & 1U) != 0)) ||
          (pbVar7 = tcu::Vector<bool,_4>::operator[](&state->colorMask,2), (*pbVar7 & 1U) != 0)) ||
         (pbVar7 = tcu::Vector<bool,_4>::operator[](&state->colorMask,3), (*pbVar7 & 1U) != 0)) {
        executeSignedValueWrite
                  (this,fragNdxOffset,iVar3,inputFragments,&state->colorMask,
                   (PixelBufferAccess *)this_00);
      }
    }
  }
  return;
}

Assistant:

void FragmentProcessor::render (const rr::MultisamplePixelBufferAccess&		msColorBuffer,
								const rr::MultisamplePixelBufferAccess&		msDepthBuffer,
								const rr::MultisamplePixelBufferAccess&		msStencilBuffer,
								const Fragment*								inputFragments,
								int											numFragments,
								FaceType									fragmentFacing,
								const FragmentOperationState&				state)
{
	DE_ASSERT(fragmentFacing < FACETYPE_LAST);
	DE_ASSERT(state.numStencilBits < 32); // code bitshifts numStencilBits, avoid undefined behavior

	const tcu::PixelBufferAccess&	colorBuffer			= msColorBuffer.raw();
	const tcu::PixelBufferAccess&	depthBuffer			= msDepthBuffer.raw();
	const tcu::PixelBufferAccess&	stencilBuffer		= msStencilBuffer.raw();

	bool							hasDepth			= depthBuffer.getWidth() > 0	&& depthBuffer.getHeight() > 0		&& depthBuffer.getDepth() > 0;
	bool							hasStencil			= stencilBuffer.getWidth() > 0	&& stencilBuffer.getHeight() > 0	&& stencilBuffer.getDepth() > 0;
	bool							doDepthTest			= hasDepth && state.depthTestEnabled;
	bool							doStencilTest		= hasStencil && state.stencilTestEnabled;

	tcu::TextureChannelClass		colorbufferClass	= tcu::getTextureChannelClass(msColorBuffer.raw().getFormat().type);
	rr::GenericVecType				fragmentDataType	= (colorbufferClass == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER) ? (rr::GENERICVECTYPE_INT32) : ((colorbufferClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER) ? (rr::GENERICVECTYPE_UINT32) : (rr::GENERICVECTYPE_FLOAT));

	DE_ASSERT((!hasDepth || colorBuffer.getWidth() == depthBuffer.getWidth())	&& (!hasStencil || colorBuffer.getWidth() == stencilBuffer.getWidth()));
	DE_ASSERT((!hasDepth || colorBuffer.getHeight() == depthBuffer.getHeight())	&& (!hasStencil || colorBuffer.getHeight() == stencilBuffer.getHeight()));
	DE_ASSERT((!hasDepth || colorBuffer.getDepth() == depthBuffer.getDepth())	&& (!hasStencil || colorBuffer.getDepth() == stencilBuffer.getDepth()));

	// Combined formats must be separated beforehand
	DE_ASSERT(!hasDepth || (!tcu::isCombinedDepthStencilType(depthBuffer.getFormat().type) && depthBuffer.getFormat().order == tcu::TextureFormat::D));
	DE_ASSERT(!hasStencil || (!tcu::isCombinedDepthStencilType(stencilBuffer.getFormat().type) && stencilBuffer.getFormat().order == tcu::TextureFormat::S));

	int						numSamplesPerFragment		= colorBuffer.getWidth();
	int						totalNumSamples				= numFragments*numSamplesPerFragment;
	int						numSampleGroups				= (totalNumSamples - 1) / SAMPLE_REGISTER_SIZE + 1; // \note totalNumSamples/SAMPLE_REGISTER_SIZE rounded up.
	const StencilState&		stencilState				= state.stencilStates[fragmentFacing];
	Vec4					colorMaskFactor				(state.colorMask[0] ? 1.0f : 0.0f, state.colorMask[1] ? 1.0f : 0.0f, state.colorMask[2] ? 1.0f : 0.0f, state.colorMask[3] ? 1.0f : 0.0f);
	Vec4					colorMaskNegationFactor		(state.colorMask[0] ? 0.0f : 1.0f, state.colorMask[1] ? 0.0f : 1.0f, state.colorMask[2] ? 0.0f : 1.0f, state.colorMask[3] ? 0.0f : 1.0f);
	bool					sRGBTarget					= state.sRGBEnabled && tcu::isSRGB(colorBuffer.getFormat());

	DE_ASSERT(SAMPLE_REGISTER_SIZE % numSamplesPerFragment == 0);

	// Divide the fragments' samples into groups of size SAMPLE_REGISTER_SIZE, and perform
	// the per-sample operations for one group at a time.

	for (int sampleGroupNdx = 0; sampleGroupNdx < numSampleGroups; sampleGroupNdx++)
	{
		// The index of the fragment of the sample at the beginning of m_sampleRegisters.
		int groupFirstFragNdx = (sampleGroupNdx*SAMPLE_REGISTER_SIZE) / numSamplesPerFragment;

		// Initialize sample data in the sample register.

		for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
		{
			int fragNdx			= groupFirstFragNdx + regSampleNdx/numSamplesPerFragment;
			int fragSampleNdx	= regSampleNdx % numSamplesPerFragment;

			if (fragNdx < numFragments)
			{
				m_sampleRegister[regSampleNdx].isAlive		= (inputFragments[fragNdx].coverage & (1u << fragSampleNdx)) != 0;
				m_sampleRegister[regSampleNdx].depthPassed	= true; // \note This will stay true if depth test is disabled.
			}
			else
				m_sampleRegister[regSampleNdx].isAlive = false;
		}

		// Scissor test.

		if (state.scissorTestEnabled)
			executeScissorTest(groupFirstFragNdx, numSamplesPerFragment, inputFragments, state.scissorRectangle);

		// Stencil test.

		if (doStencilTest)
		{
			executeStencilCompare(groupFirstFragNdx, numSamplesPerFragment, inputFragments, stencilState, state.numStencilBits, stencilBuffer);
			executeStencilSFail(groupFirstFragNdx, numSamplesPerFragment, inputFragments, stencilState, state.numStencilBits, stencilBuffer);
		}

		// Depth test.
		// \note Current value of isAlive is needed for dpPass and dpFail, so it's only updated after them and not right after depth test.

		if (doDepthTest)
		{
			executeDepthCompare(groupFirstFragNdx, numSamplesPerFragment, inputFragments, state.depthFunc, depthBuffer);

			if (state.depthMask)
				executeDepthWrite(groupFirstFragNdx, numSamplesPerFragment, inputFragments, depthBuffer);
		}

		// Do dpFail and dpPass stencil writes.

		if (doStencilTest)
			executeStencilDpFailAndPass(groupFirstFragNdx, numSamplesPerFragment, inputFragments, stencilState, state.numStencilBits, stencilBuffer);

		// Kill the samples that failed depth test.

		if (doDepthTest)
		{
			for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
				m_sampleRegister[regSampleNdx].isAlive = m_sampleRegister[regSampleNdx].isAlive && m_sampleRegister[regSampleNdx].depthPassed;
		}

		// Paint fragments to target

		switch (fragmentDataType)
		{
			case rr::GENERICVECTYPE_FLOAT:
			{
				// Select min/max clamping values for blending factors and operands
				Vec4 minClampValue;
				Vec4 maxClampValue;

				if (colorbufferClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)
				{
					minClampValue = Vec4(0.0f);
					maxClampValue = Vec4(1.0f);
				}
				else if (colorbufferClass == tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT)
				{
					minClampValue = Vec4(-1.0f);
					maxClampValue = Vec4(1.0f);
				}
				else
				{
					// No clamping
					minClampValue = Vec4(-std::numeric_limits<float>::infinity());
					maxClampValue = Vec4(std::numeric_limits<float>::infinity());
				}

				// Blend calculation - only if using blend.
				if (state.blendMode == BLENDMODE_STANDARD)
				{
					// Put dst color to register, doing srgb-to-linear conversion if needed.
					for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
					{
						if (m_sampleRegister[regSampleNdx].isAlive)
						{
							int					fragSampleNdx	= regSampleNdx % numSamplesPerFragment;
							const Fragment&		frag			= inputFragments[groupFirstFragNdx + regSampleNdx/numSamplesPerFragment];
							Vec4				dstColor		= colorBuffer.getPixel(fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());

							m_sampleRegister[regSampleNdx].clampedBlendSrcColor		= clamp(frag.value.get<float>(), minClampValue, maxClampValue);
							m_sampleRegister[regSampleNdx].clampedBlendSrc1Color	= clamp(frag.value1.get<float>(), minClampValue, maxClampValue);
							m_sampleRegister[regSampleNdx].clampedBlendDstColor		= clamp(sRGBTarget ? tcu::sRGBToLinear(dstColor) : dstColor, minClampValue, maxClampValue);
						}
					}

					// Calculate blend factors to register.
					executeBlendFactorComputeRGB(state.blendColor, state.blendRGBState);
					executeBlendFactorComputeA(state.blendColor, state.blendAState);

					// Compute blended color.
					executeBlend(state.blendRGBState, state.blendAState);
				}
				else if (state.blendMode == BLENDMODE_ADVANCED)
				{
					// Unpremultiply colors for blending, and do sRGB->linear if necessary
					// \todo [2014-03-17 pyry] Re-consider clampedBlend*Color var names
					for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
					{
						if (m_sampleRegister[regSampleNdx].isAlive)
						{
							int					fragSampleNdx	= regSampleNdx % numSamplesPerFragment;
							const Fragment&		frag			= inputFragments[groupFirstFragNdx + regSampleNdx/numSamplesPerFragment];
							const Vec4			srcColor		= frag.value.get<float>();
							const Vec4			dstColor		= colorBuffer.getPixel(fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());

							m_sampleRegister[regSampleNdx].clampedBlendSrcColor		= unpremultiply(clamp(srcColor, minClampValue, maxClampValue));
							m_sampleRegister[regSampleNdx].clampedBlendDstColor		= unpremultiply(clamp(sRGBTarget ? tcu::sRGBToLinear(dstColor) : dstColor, minClampValue, maxClampValue));
						}
					}

					executeAdvancedBlend(state.blendEquationAdvaced);
				}
				else
				{
					// Not using blend - just put values to register as-is.
					DE_ASSERT(state.blendMode == BLENDMODE_NONE);

					for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
					{
						if (m_sampleRegister[regSampleNdx].isAlive)
						{
							const Fragment& frag = inputFragments[groupFirstFragNdx + regSampleNdx/numSamplesPerFragment];

							m_sampleRegister[regSampleNdx].blendedRGB	= frag.value.get<float>().xyz();
							m_sampleRegister[regSampleNdx].blendedA		= frag.value.get<float>().w();
						}
					}
				}

				// Clamp result values in sample register
				if (colorbufferClass != tcu::TEXTURECHANNELCLASS_FLOATING_POINT)
				{
					for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
					{
						if (m_sampleRegister[regSampleNdx].isAlive)
						{
							m_sampleRegister[regSampleNdx].blendedRGB	= clamp(m_sampleRegister[regSampleNdx].blendedRGB, minClampValue.swizzle(0, 1, 2), maxClampValue.swizzle(0, 1, 2));
							m_sampleRegister[regSampleNdx].blendedA		= clamp(m_sampleRegister[regSampleNdx].blendedA, minClampValue.w(), maxClampValue.w());
						}
					}
				}

				// Finally, write the colors to the color buffer.

				if (state.colorMask[0] && state.colorMask[1] && state.colorMask[2] && state.colorMask[3])
				{
					if (colorBuffer.getFormat() == tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8))
						executeRGBA8ColorWrite(groupFirstFragNdx, numSamplesPerFragment, inputFragments, colorBuffer);
					else
						executeColorWrite(groupFirstFragNdx, numSamplesPerFragment, inputFragments, sRGBTarget, colorBuffer);
				}
				else if (state.colorMask[0] || state.colorMask[1] || state.colorMask[2] || state.colorMask[3])
					executeMaskedColorWrite(groupFirstFragNdx, numSamplesPerFragment, inputFragments, colorMaskFactor, colorMaskNegationFactor, sRGBTarget, colorBuffer);
				break;
			}
			case rr::GENERICVECTYPE_INT32:
				// Write fragments
				for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
				{
					if (m_sampleRegister[regSampleNdx].isAlive)
					{
						const Fragment& frag = inputFragments[groupFirstFragNdx + regSampleNdx/numSamplesPerFragment];

						m_sampleRegister[regSampleNdx].signedValue = frag.value.get<deInt32>();
					}
				}

				if (state.colorMask[0] || state.colorMask[1] || state.colorMask[2] || state.colorMask[3])
					executeSignedValueWrite(groupFirstFragNdx, numSamplesPerFragment, inputFragments, state.colorMask, colorBuffer);
				break;

			case rr::GENERICVECTYPE_UINT32:
				// Write fragments
				for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
				{
					if (m_sampleRegister[regSampleNdx].isAlive)
					{
						const Fragment& frag = inputFragments[groupFirstFragNdx + regSampleNdx/numSamplesPerFragment];

						m_sampleRegister[regSampleNdx].unsignedValue = frag.value.get<deUint32>();
					}
				}

				if (state.colorMask[0] || state.colorMask[1] || state.colorMask[2] || state.colorMask[3])
					executeUnsignedValueWrite(groupFirstFragNdx, numSamplesPerFragment, inputFragments, state.colorMask, colorBuffer);
				break;

			default:
				DE_ASSERT(DE_FALSE);
		}
	}
}